

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nth_valueFinalizeFunc(sqlite3_context *pCtx)

{
  void *pvVar1;
  NthValueCtx *p;
  sqlite3_context *pCtx_local;
  
  pvVar1 = sqlite3_aggregate_context(pCtx,0);
  if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 8) != 0)) {
    sqlite3_result_value(pCtx,*(sqlite3_value **)((long)pvVar1 + 8));
    sqlite3_value_free(*(sqlite3_value **)((long)pvVar1 + 8));
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  return;
}

Assistant:

static void nth_valueFinalizeFunc(sqlite3_context *pCtx){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, 0);
  if( p && p->pValue ){
    sqlite3_result_value(pCtx, p->pValue);
    sqlite3_value_free(p->pValue);
    p->pValue = 0;
  }
}